

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void exit_frame(flatcc_builder_t *B)

{
  flatcc_builder_t *B_local;
  
  memset(B->ds,0,(ulong)B->ds_offset);
  B->ds_offset = B->frame->ds_offset;
  B->ds_first = B->frame->ds_first;
  refresh_ds(B,B->frame->type_limit);
  set_min_align(B,B->align);
  B->align = B->frame->align;
  B->frame = B->frame + -1;
  B->level = B->level + -1;
  return;
}

Assistant:

static inline void exit_frame(flatcc_builder_t *B)
{
    memset(B->ds, 0, B->ds_offset);
    B->ds_offset = frame(ds_offset);
    B->ds_first = frame(ds_first);
    refresh_ds(B, frame(type_limit));

    /*
     * Restore local alignment: e.g. a table should not change alignment
     * because a child table was just created elsewhere in the buffer,
     * but the overall alignment (min align), should be aware of it.
     * Each buffer has its own min align that then migrates up without
     * being affected by sibling or child buffers.
     */
    set_min_align(B, B->align);
    B->align = frame(align);

    --B->frame;
    --B->level;
}